

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O3

void remap_terminal_trees<PredictionData<float,unsigned_long>,unsigned_long>
               (IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,
               PredictionData<float,_unsigned_long> *prediction_data,unsigned_long *tree_num,
               int nthreads)

{
  pointer pvVar1;
  pointer pvVar2;
  size_t sVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer puVar6;
  pointer puVar7;
  pointer pvVar8;
  long *plVar9;
  pointer pvVar10;
  ulong uVar11;
  long lVar12;
  unsigned_long uVar13;
  size_t sVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tree_mapping;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  size_t local_48;
  unsigned_long *local_40;
  PredictionData<float,_unsigned_long> *local_38;
  
  local_40 = tree_num;
  local_38 = prediction_data;
  if (model_outputs == (IsoForest *)0x0) {
    pvVar4 = (model_outputs_ext->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = (model_outputs_ext->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar16 = 0;
    pvVar10 = pvVar4;
    if ((long)pvVar5 - (long)pvVar4 != 0) {
      do {
        uVar11 = ((long)(pvVar10->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)(pvVar10->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl
                        .super__Vector_impl_data._M_start >> 3) * -0x1084210842108421;
        if (uVar16 <= uVar11 && uVar11 - uVar16 != 0) {
          uVar16 = uVar11;
        }
        pvVar10 = pvVar10 + 1;
      } while (pvVar10 != pvVar5);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_68,uVar16);
    puVar7 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar6 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pvVar4 != pvVar5) {
      lVar15 = ((long)pvVar5 - (long)pvVar4 >> 3) * -0x5555555555555555;
      pvVar4 = (model_outputs_ext->hplanes).
               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_48 = ((long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                  (-8 - (long)local_68.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8;
      lVar19 = 0;
      lVar18 = 0;
      do {
        if (puVar6 != puVar7) {
          memset(puVar6,0,local_48);
        }
        lVar17 = *(long *)&pvVar4[lVar18].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>.
                           _M_impl;
        lVar12 = (long)*(pointer *)
                        ((long)&pvVar4[lVar18].
                                super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>._M_impl +
                        8) - lVar17;
        if (lVar12 != 0) {
          lVar12 = (lVar12 >> 3) * -0x1084210842108421;
          plVar9 = (long *)(lVar17 + 200);
          lVar17 = 0;
          uVar13 = 0;
          do {
            if (*plVar9 == 0) {
              puVar6[lVar17] = uVar13;
              uVar13 = uVar13 + 1;
            }
            lVar17 = lVar17 + 1;
            plVar9 = plVar9 + 0x1f;
          } while (lVar12 + (ulong)(lVar12 == 0) != lVar17);
        }
        sVar3 = local_38->nrows;
        if (sVar3 != 0) {
          sVar14 = 0;
          do {
            *(unsigned_long *)((long)local_40 + sVar14 * 8 + sVar3 * lVar19) =
                 puVar6[*(long *)((long)local_40 + sVar14 * 8 + sVar3 * lVar19)];
            sVar14 = sVar14 + 1;
          } while (sVar3 != sVar14);
        }
        lVar18 = lVar18 + 1;
        lVar19 = lVar19 + 8;
      } while (lVar18 != lVar15 + (ulong)(lVar15 == 0));
    }
  }
  else {
    pvVar1 = (model_outputs->trees).
             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (model_outputs->trees).
             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar16 = 0;
    pvVar8 = pvVar1;
    if ((long)pvVar2 - (long)pvVar1 != 0) {
      do {
        uVar11 = ((long)(pvVar8->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar8->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
        if (uVar16 <= uVar11 && uVar11 - uVar16 != 0) {
          uVar16 = uVar11;
        }
        pvVar8 = pvVar8 + 1;
      } while (pvVar8 != pvVar2);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_68,uVar16);
    puVar7 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar6 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pvVar1 != pvVar2) {
      lVar15 = ((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555;
      pvVar1 = (model_outputs->trees).
               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_48 = ((long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                  (-8 - (long)local_68.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8;
      lVar19 = 0;
      lVar18 = 0;
      do {
        if (puVar6 != puVar7) {
          memset(puVar6,0,local_48);
        }
        lVar17 = *(long *)&pvVar1[lVar18].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>.
                           _M_impl;
        lVar12 = (long)*(pointer *)
                        ((long)&pvVar1[lVar18].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>
                                ._M_impl + 8) - lVar17;
        if (lVar12 != 0) {
          lVar12 = (lVar12 >> 4) * 0x6db6db6db6db6db7;
          plVar9 = (long *)(lVar17 + 0x38);
          uVar13 = 0;
          lVar17 = 0;
          do {
            if (*plVar9 == 0) {
              puVar6[lVar17] = uVar13;
              uVar13 = uVar13 + 1;
            }
            lVar17 = lVar17 + 1;
            plVar9 = plVar9 + 0xe;
          } while (lVar12 + (ulong)(lVar12 == 0) != lVar17);
        }
        sVar3 = local_38->nrows;
        if (sVar3 != 0) {
          sVar14 = 0;
          do {
            *(unsigned_long *)((long)local_40 + sVar14 * 8 + sVar3 * lVar19) =
                 puVar6[*(long *)((long)local_40 + sVar14 * 8 + sVar3 * lVar19)];
            sVar14 = sVar14 + 1;
          } while (sVar3 != sVar14);
        }
        lVar18 = lVar18 + 1;
        lVar19 = lVar19 + 8;
      } while (lVar18 != lVar15 + (ulong)(lVar15 == 0));
    }
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void remap_terminal_trees(IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                          PredictionData &prediction_data, sparse_ix *restrict tree_num, int nthreads)
{
    size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
    size_t max_tree, curr_term;
    std::vector<sparse_ix> tree_mapping;
    if (model_outputs != NULL)
    {
        max_tree = std::accumulate(model_outputs->trees.begin(),
                                   model_outputs->trees.end(),
                                   (size_t)0,
                                   [](const size_t curr_max, const std::vector<IsoTree> &tr)
                                   {return std::max(curr_max, tr.size());});
        tree_mapping.resize(max_tree);
        for (size_t tree = 0; tree < ntrees; tree++)
        {
            std::fill(tree_mapping.begin(), tree_mapping.end(), (size_t)0);
            curr_term = 0;
            for (size_t node = 0; node < model_outputs->trees[tree].size(); node++)
                if (model_outputs->trees[tree][node].tree_left == 0)
                    tree_mapping[node] = curr_term++;

            #pragma omp parallel for schedule(static) num_threads(nthreads) shared(tree_num, tree_mapping, tree, prediction_data)
            for (size_t_for row = 0; row < (decltype(row))prediction_data.nrows; row++)
                tree_num[row + tree * prediction_data.nrows] = tree_mapping[tree_num[row + tree * prediction_data.nrows]];
        }
    }

    else
    {
        max_tree = std::accumulate(model_outputs_ext->hplanes.begin(),
                                   model_outputs_ext->hplanes.end(),
                                   (size_t)0,
                                   [](const size_t curr_max, const std::vector<IsoHPlane> &tr)
                                   {return std::max(curr_max, tr.size());});
        tree_mapping.resize(max_tree);
        for (size_t tree = 0; tree < ntrees; tree++)
        {
            std::fill(tree_mapping.begin(), tree_mapping.end(), (size_t)0);
            curr_term = 0;
            for (size_t node = 0; node < model_outputs_ext->hplanes[tree].size(); node++)
                if (model_outputs_ext->hplanes[tree][node].hplane_left == 0)
                    tree_mapping[node] = curr_term++;
            
            #pragma omp parallel for schedule(static) num_threads(nthreads) shared(tree_num, tree_mapping, tree, prediction_data)
            for (size_t_for row = 0; row < (decltype(row))prediction_data.nrows; row++)
                tree_num[row + tree * prediction_data.nrows] = tree_mapping[tree_num[row + tree * prediction_data.nrows]];
        }
    }
}